

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fepoll.cpp
# Opt level: O1

int __thiscall fepoll::update(fepoll *this,int timeout)

{
  uint uVar1;
  long lVar2;
  epoll_event results [64];
  epoll_event local_318 [48];
  
  if (0 < this->epfd_) {
    uVar1 = epoll_wait(this->epfd_,local_318,0x40,timeout);
    if (0 < (int)uVar1) {
      lVar2 = 0;
      do {
        (**(code **)(**(long **)(&local_318[0].field_0x4 + lVar2) + 0x10))
                  (*(long **)(&local_318[0].field_0x4 + lVar2),
                   *(undefined4 *)((long)&local_318[0].events + lVar2));
        lVar2 = lVar2 + 0xc;
      } while ((ulong)uVar1 * 0xc != lVar2);
    }
    return uVar1;
  }
  __assert_fail("epfd_ > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/protonet/fepoll.cpp"
                ,0x26,"virtual int fepoll::update(int)");
}

Assistant:

int fepoll::update(int timeout)
{
    assert(epfd_ > 0);
    epoll_event results[64];
    int count = epoll_wait(epfd_, results, 64, timeout);
    for (int i = 0; i < count; i++)
    {
        unsigned int events = results[i].events;
        iobject* object = (iobject*)results[i].data.ptr;
        object->on_event(events);
    }
    return count;
}